

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

int __thiscall crnlib::mipmapped_texture::init(mipmapped_texture *this,EVP_PKEY_CTX *ctx)

{
  component_flags cVar1;
  int iVar2;
  dxt_format dVar3;
  vector<crnlib::mip_level_*> *pvVar4;
  mip_level *pmVar5;
  mip_level **ppmVar6;
  dxt_image *this_00;
  image<crnlib::color_quad<unsigned_char,_int>_> *this_01;
  pixel_format in_ECX;
  uint in_EDX;
  uint *init1;
  uint in_R8D;
  uint in_R9D;
  char *in_stack_00000008;
  orientation_flags_t in_stack_00000010;
  image_u8 *p_1;
  dxt_image *p;
  uint local_30;
  uint mip_height;
  uint mip_width;
  uint l;
  uint f;
  pixel_format fmt_local;
  uint faces_local;
  uint levels_local;
  uint height_local;
  uint width_local;
  mipmapped_texture *this_local;
  
  levels_local = (uint)ctx;
  l = in_R9D;
  f = in_R8D;
  fmt_local = in_ECX;
  faces_local = in_EDX;
  _height_local = this;
  clear(this);
  this->m_width = levels_local;
  this->m_height = faces_local;
  cVar1 = pixel_format_helpers::get_component_flags(l);
  this->m_comp_flags = cVar1;
  this->m_format = l;
  if (in_stack_00000008 != (char *)0x0) {
    dynamic_string::set(&this->m_name,in_stack_00000008,0xffffffff);
  }
  vector<crnlib::vector<crnlib::mip_level_*>_>::resize(&this->m_faces,f,false);
  for (mip_width = 0; mip_width < f; mip_width = mip_width + 1) {
    pvVar4 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&this->m_faces,mip_width);
    vector<crnlib::mip_level_*>::resize(pvVar4,fmt_local,false);
    for (mip_height = 0; mip_height < fmt_local; mip_height = mip_height + 1) {
      pmVar5 = crnlib_new<crnlib::mip_level>();
      pvVar4 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&this->m_faces,mip_width);
      ppmVar6 = vector<crnlib::mip_level_*>::operator[](pvVar4,mip_height);
      *ppmVar6 = pmVar5;
      local_30 = math::maximum<unsigned_int>(1,levels_local >> ((byte)mip_height & 0x1f));
      p._4_4_ = math::maximum<unsigned_int>(1,faces_local >> ((byte)mip_height & 0x1f));
      iVar2 = pixel_format_helpers::is_dxt(l);
      if (iVar2 == 0) {
        this_01 = crnlib_new<crnlib::image<crnlib::color_quad<unsigned_char,int>>,unsigned_int,unsigned_int>
                            ((crnlib *)&local_30,(uint *)((long)&p + 4),init1);
        image<crnlib::color_quad<unsigned_char,_int>_>::set_comp_flags(this_01,this->m_comp_flags);
        pvVar4 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&this->m_faces,mip_width);
        ppmVar6 = vector<crnlib::mip_level_*>::operator[](pvVar4,mip_height);
        mip_level::assign(*ppmVar6,this_01,this->m_format,in_stack_00000010);
      }
      else {
        this_00 = crnlib_new<crnlib::dxt_image>();
        dVar3 = pixel_format_helpers::get_dxt_format(l);
        dxt_image::init(this_00,(EVP_PKEY_CTX *)(ulong)(uint)dVar3);
        pvVar4 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&this->m_faces,mip_width);
        ppmVar6 = vector<crnlib::mip_level_*>::operator[](pvVar4,mip_height);
        mip_level::assign(*ppmVar6,this_00,this->m_format,in_stack_00000010);
      }
    }
  }
  return mip_width;
}

Assistant:

void mipmapped_texture::init(uint width, uint height, uint levels, uint faces, pixel_format fmt, const char* pName, orientation_flags_t orient_flags) {
  clear();

  CRNLIB_ASSERT((width > 0) && (height > 0) && (levels > 0));
  CRNLIB_ASSERT((faces == 1) || (faces == 6));

  m_width = width;
  m_height = height;
  m_comp_flags = pixel_format_helpers::get_component_flags(fmt);
  m_format = fmt;
  if (pName)
    m_name.set(pName);

  m_faces.resize(faces);
  for (uint f = 0; f < faces; f++) {
    m_faces[f].resize(levels);
    for (uint l = 0; l < levels; l++) {
      m_faces[f][l] = crnlib_new<mip_level>();

      const uint mip_width = math::maximum(1U, width >> l);
      const uint mip_height = math::maximum(1U, height >> l);
      if (pixel_format_helpers::is_dxt(fmt)) {
        dxt_image* p = crnlib_new<dxt_image>();
        p->init(pixel_format_helpers::get_dxt_format(fmt), mip_width, mip_height, true);
        m_faces[f][l]->assign(p, m_format, orient_flags);
      } else {
        image_u8* p = crnlib_new<image_u8>(mip_width, mip_height);
        p->set_comp_flags(m_comp_flags);
        m_faces[f][l]->assign(p, m_format, orient_flags);
      }
    }
  }

  CRNLIB_ASSERT(check());
}